

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListSortBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments,OrderType *order,OrderByNullType *null_order)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  char cVar6;
  reference pvVar7;
  pointer pEVar8;
  reference pvVar9;
  ListSortBindData *this_00;
  LogicalType *pLVar10;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LogicalType child_type;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Expression *local_78;
  duckdb *local_70;
  OrderByNullType *local_68;
  LogicalType local_60;
  LogicalType local_5f;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_70 = this;
  local_68 = null_order;
  duckdb::LogicalType::LogicalType(&local_60);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
  cVar6 = duckdb::LogicalType::operator==((LogicalType *)(pEVar8 + 0x38),(LogicalType *)&local_90);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_90);
  if (cVar6 == '\0') {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    local_78 = (pvVar7->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::BoundCastExpression::AddArrayCastToList(&local_90);
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    _Var5._M_head_impl = local_90;
    local_90 = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    if (local_90 != (Expression *)0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
    local_90 = (Expression *)0x0;
    if (local_78 != (Expression *)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
    local_78 = (Expression *)0x0;
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pLVar10 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar8 + 0x38));
    if (&local_60 != pLVar10) {
      local_60 = *pLVar10;
      local_5f = pLVar10[1];
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_58,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pLVar10 + 8));
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
    if (pvVar9 != (reference)(pEVar8 + 0x38)) {
      *pvVar9 = (value_type)pEVar8[0x38];
      *(Expression *)(pvVar9 + 1) = pEVar8[0x39];
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar9 + 8),
                 (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar8 + 0x40));
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    if ((pointer)&bound_function->field_0x90 != pEVar8 + 0x38) {
      bound_function->field_0x90 = pEVar8[0x38];
      bound_function->field_0x91 = pEVar8[0x39];
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x98,
                 (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar8 + 0x40));
    }
    this_00 = (ListSortBindData *)operator_new(0xf0);
    ListSortBindData::ListSortBindData
              (this_00,*order,*local_68,false,(LogicalType *)&bound_function->field_0x90,&local_60,
               context);
  }
  else {
    duckdb::LogicalType::LogicalType((LogicalType *)&local_90,UNKNOWN);
    pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
    uVar4 = uStack_80;
    uVar3 = local_88;
    *pvVar9 = local_90._0_1_;
    pvVar9[1] = local_90._1_1_;
    uVar12 = *(undefined4 *)(pvVar9 + 8);
    uVar14 = *(undefined4 *)(pvVar9 + 0x10);
    *(undefined8 *)(pvVar9 + 8) = 0;
    *(undefined8 *)(pvVar9 + 0x10) = 0;
    local_88 = 0;
    uStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pvVar9 + 0x10);
    *(undefined8 *)(pvVar9 + 8) = uVar3;
    *(undefined8 *)(pvVar9 + 0x10) = uVar4;
    uVar13 = *(undefined4 *)(pvVar9 + 0xc);
    uVar15 = *(undefined4 *)(pvVar9 + 0x14);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_48 = uVar12;
      uStack_44 = *(undefined4 *)(pvVar9 + 0xc);
      uStack_40 = uVar14;
      uStack_3c = *(undefined4 *)(pvVar9 + 0x14);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar12 = local_48;
      uVar13 = uStack_44;
      uVar14 = uStack_40;
      uVar15 = uStack_3c;
    }
    p_Var1 = uStack_80;
    local_88 = CONCAT44(uVar13,uVar12);
    uStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar15,uVar14);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_90);
    duckdb::LogicalType::LogicalType((LogicalType *)&local_90,SQLNULL);
    bound_function->field_0x90 = local_90._0_1_;
    bound_function->field_0x91 = local_90._1_1_;
    uVar3 = *(undefined8 *)&bound_function->field_0x98;
    uVar4 = *(undefined8 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = local_88;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0 = uStack_80;
    local_88 = uVar3;
    uStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_90);
    if (&local_60 != (LogicalType *)&bound_function->field_0x90) {
      local_60 = (LogicalType)bound_function->field_0x90;
      local_5f = (LogicalType)bound_function->field_0x91;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_58,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x98);
    }
    this_00 = (ListSortBindData *)operator_new(0xf0);
    ListSortBindData::ListSortBindData
              (this_00,*order,*local_68,false,(LogicalType *)&bound_function->field_0x90,&local_60,
               context);
  }
  *(ListSortBindData **)local_70 = this_00;
  uVar11.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
       duckdb::LogicalType::~LogicalType(&local_60);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>)
         uVar11.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListSortBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments, OrderType &order,
                                             OrderByNullType &null_order) {

	LogicalType child_type;
	if (arguments[0]->return_type == LogicalTypeId::UNKNOWN) {
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		child_type = bound_function.return_type;
		return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	child_type = ListType::GetChildType(arguments[0]->return_type);

	bound_function.arguments[0] = arguments[0]->return_type;
	bound_function.return_type = arguments[0]->return_type;

	return make_uniq<ListSortBindData>(order, null_order, false, bound_function.return_type, child_type, context);
}